

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::CalculateP2WSH(Address *this,ByteData256 *hash_data,string *bech32_hrp)

{
  pointer *this_00;
  size_type sVar1;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  ulong uVar2;
  reference this_01;
  CfdException *this_02;
  char *addr_family;
  undefined8 uVar3;
  char *wally_string;
  AddressFormatData *in_stack_fffffffffffffdd8;
  AddressFormatData *in_stack_fffffffffffffde0;
  allocator *paVar4;
  string *in_stack_fffffffffffffdf0;
  string *message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_03;
  CfdError error_code;
  string local_1b8;
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  undefined1 local_169 [33];
  StringUtil local_148 [32];
  CfdSourceLocation local_128;
  CfdSourceLocation local_110;
  int local_f4;
  WallyUtil *pWStack_f0;
  int ret;
  char *output;
  undefined1 local_c8 [8];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> prefix_list;
  string human_code;
  value_type local_6d [20];
  undefined1 local_59;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> segwit_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *script_hash_byte;
  string *bech32_hrp_local;
  ByteData256 *hash_data_local;
  Address *this_local;
  
  this_00 = &segwit_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,hash_data);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x487431);
  local_59 = (undefined1)this->witness_ver_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,&local_59);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  local_6d[0] = (value_type)sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,local_6d);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffdd8);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_fffffffffffffdd8);
  __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  ::std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,__result);
  ::std::__cxx11::string::string
            ((string *)
             &prefix_list.
              super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)bech32_hrp);
  uVar2 = ::std::__cxx11::string::empty();
  if ((((uVar2 & 1) != 0) && (kCfdUnknownError < this->type_)) &&
     (this->type_ < kCfdOutOfRangeError)) {
    GetBitcoinAddressFormatList();
    this_01 = ::std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)local_c8,(ulong)(uint)this->type_);
    AddressFormatData::GetBech32Hrp_abi_cxx11_((string *)&output,this_01);
    ::std::__cxx11::string::operator=
              ((string *)
               &prefix_list.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&output);
    ::std::__cxx11::string::~string((string *)&output);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    operator[]((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)local_c8,(ulong)(uint)this->type_);
    AddressFormatData::operator=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    SetNetType(this,&this->format_data_);
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            in_stack_fffffffffffffdf0);
  }
  pWStack_f0 = (WallyUtil *)0x0;
  this_03 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58;
  this_02 = (CfdException *)
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x48761d);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_03);
  error_code = (CfdError)((ulong)this_03 >> 0x20);
  addr_family = (char *)::std::__cxx11::string::data();
  local_f4 = wally_addr_segwit_from_bytes
                       ((uchar *)this_02,sVar1,addr_family,0,(char **)&stack0xffffffffffffff10);
  if (local_f4 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_(&local_1b8,pWStack_f0,wally_string);
    ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    ::std::__cxx11::string::~string
              ((string *)
               &prefix_list.
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
    return;
  }
  local_110.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_110.filename = local_110.filename + 1;
  local_110.line = 0x435;
  local_110.funcname = "CalculateP2WSH";
  logger::warn<int&>(&local_110,"wally_addr_segwit_from_bytes error. ret={}.",&local_f4);
  local_128.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_128.filename = local_128.filename + 1;
  local_128.line = 0x437;
  local_128.funcname = "CalculateP2WSH";
  StringUtil::ByteToString_abi_cxx11_
            (local_148,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  logger::info<std::__cxx11::string>
            (&local_128,"input hash={}",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  ::std::__cxx11::string::~string((string *)local_148);
  if (local_f4 != -2) {
    local_192 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    paVar4 = &local_191;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_190,"Segwit-address create error.",paVar4);
    CfdException::CfdException(this_02,error_code,in_stack_fffffffffffffdf0);
    local_192 = 0;
    __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_16a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  message = (string *)local_169;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)(local_169 + 1),"Segwit-address create error.",(allocator *)message);
  CfdException::CfdException(this_02,error_code,message);
  local_16a = 0;
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Address::CalculateP2WSH(
    const ByteData256& hash_data, const std::string& bech32_hrp) {
  const std::vector<uint8_t>& script_hash_byte = hash_data.GetBytes();
  std::vector<uint8_t> segwit_data;

  // 0byte目にwitness_version, 1byte目にhashサイズ
  segwit_data.push_back(witness_ver_);
  segwit_data.push_back(static_cast<uint8_t>(script_hash_byte.size()));
  std::copy(
      script_hash_byte.begin(), script_hash_byte.end(),
      std::back_inserter(segwit_data));

  std::string human_code = bech32_hrp;
  if (human_code.empty() && (kMainnet <= type_) && (type_ <= kRegtest)) {
    auto prefix_list = GetBitcoinAddressFormatList();
    human_code = prefix_list[type_].GetBech32Hrp();
    format_data_ = prefix_list[type_];
    SetNetType(format_data_);
  }
  char* output = NULL;
  // segwit
  int ret = wally_addr_segwit_from_bytes(
      segwit_data.data(), segwit_data.size(), human_code.data(), 0, &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_addr_segwit_from_bytes error. ret={}.", ret);
    info(
        CFD_LOG_SOURCE, "input hash={}",
        StringUtil::ByteToString(segwit_data));
    if (ret == WALLY_EINVAL) {
      throw CfdException(
          kCfdIllegalArgumentError, "Segwit-address create error.");
    } else {
      throw CfdException(kCfdInternalError, "Segwit-address create error.");
    }
  }

  address_ = WallyUtil::ConvertStringAndFree(output);
}